

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O1

void PrintTools::PrintVectorCout<bool>(vector<bool,_std::allocator<bool>_> *v)

{
  uint uVar1;
  _Bit_type *p_Var2;
  ostream *poVar3;
  _Bit_type *p_Var4;
  uint uVar5;
  bool bVar6;
  stringstream ss;
  long *local_388;
  long local_380;
  long local_378 [2];
  vector<bool,_std::allocator<bool>_> *local_368;
  long *local_360;
  long local_358;
  long local_350 [2];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_340);
  p_Var4 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p;
  p_Var2 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish
          .super__Bit_iterator_base._M_offset;
  local_368 = v;
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"< ",2);
  if (uVar1 != 0 || p_Var4 != p_Var2) {
    uVar5 = 0;
    do {
      if (uVar5 != 0 ||
          p_Var4 != (local_368->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
        std::__ostream_insert<char,std::char_traits<char>>(local_330,", ",2);
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_388,local_380);
      if (local_388 != local_378) {
        operator_delete(local_388,local_378[0] + 1);
      }
      bVar6 = uVar5 == 0x3f;
      uVar5 = uVar5 + 1;
      p_Var4 = p_Var4 + bVar6;
      if (bVar6) {
        uVar5 = 0;
      }
    } while (uVar5 != uVar1 || p_Var4 != p_Var2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_330," >",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_360,local_358);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  return;
}

Assistant:

static void PrintVectorCout(const std::vector<T> &v)
{
    std::cout << SoftPrintVector(v) << std::endl;
}